

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O1

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_GetDefaultLocale
              (RecyclableObject *function,CallInfo callInfo,...)

{
  char cVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  BOOL BVar7;
  charcount_t cVar8;
  undefined4 *puVar9;
  char *pcVar10;
  Recycler *this;
  JavascriptString *pJVar11;
  char *pcVar12;
  ulong uVar13;
  size_t size;
  ulong uVar14;
  size_t cbSourceString;
  ulong uVar15;
  char16 *content;
  ulong uVar16;
  uint in_stack_00000010;
  undefined1 local_1b8 [8];
  char defaultLocaleID [157];
  undefined1 local_110 [8];
  TrackAllocData data;
  char defaultLangtag [157];
  int local_34 [2];
  UErrorCode status;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x576,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b60cf2;
    *puVar9 = 0;
  }
  if ((callInfo._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x576,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00b60cf2;
    *puVar9 = 0;
  }
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)callInfo & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x576,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar4) goto LAB_00b60cf2;
    *puVar9 = 0;
  }
  local_34[0] = 0;
  memset(&data.line,0,0x9d);
  memset(local_1b8,0,0x9d);
  iVar5 = uloc_getName_70(0,local_1b8,0x9d,local_34);
  if (local_34[0] == 7) goto LAB_00b60cf4;
  if (local_34[0] < 1 && local_34[0] != -0x7c) {
    if (0x9b < iVar5 - 1U) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      pcVar12 = 
      "(localeIDActual > 0 && localeIDActual < (sizeof(*__countof_helper(defaultLocaleID)) + 0))";
      pcVar10 = 
      "localeIDActual > 0 && localeIDActual < (sizeof(*__countof_helper(defaultLocaleID)) + 0)";
      goto LAB_00b6092d;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    pcVar10 = (char *)u_errorName_70(local_34[0]);
    pcVar12 = "(false)";
LAB_00b6092d:
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x588,pcVar12,pcVar10);
    if (!bVar4) goto LAB_00b60cf2;
    *puVar9 = 0;
  }
  uVar6 = uloc_toLanguageTag_70(local_1b8,&data.line,0x9d,1);
  if (local_34[0] == 7) {
LAB_00b60cf4:
    Throw::OutOfMemory();
  }
  if (local_34[0] < 1 && local_34[0] != -0x7c) {
    if (0x9b < uVar6 - 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      pcVar12 = 
      "(langtagActual > 0 && langtagActual < (sizeof(*__countof_helper(defaultLangtag)) + 0))";
      pcVar10 = 
      "langtagActual > 0 && langtagActual < (sizeof(*__countof_helper(defaultLangtag)) + 0)";
      goto LAB_00b60a16;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    pcVar10 = (char *)u_errorName_70(local_34[0]);
    pcVar12 = "(false)";
LAB_00b60a16:
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x58b,pcVar12,pcVar10);
    if (!bVar4) goto LAB_00b60cf2;
    *puVar9 = 0;
  }
  iVar5 = uVar6 + 1;
  local_110 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_6708ef9;
  data.filename._0_4_ = 0x58d;
  data.plusSize = (long)iVar5;
  this = Memory::Recycler::TrackAllocInfo(pSVar2->recycler,(TrackAllocData *)local_110);
  if (uVar6 == 0xffffffff) {
    Memory::Recycler::ClearTrackAllocInfo(this,(TrackAllocData *)0x0);
    content = (char16 *)&DAT_00000008;
  }
  else {
    size = 0xffffffffffffffff;
    if (-1 < iVar5) {
      size = (long)iVar5 * 2;
    }
    BVar7 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar7 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00b60cf2;
      *puVar9 = 0;
    }
    content = (char16 *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                        (this,size);
    if (content == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_00b60cf2;
      *puVar9 = 0;
    }
  }
  uVar15 = (ulong)(int)uVar6;
  if ((int)uVar6 < 0) {
    *content = L'\0';
LAB_00b60bc3:
    uVar16 = 0;
  }
  else {
    if (content == (char16 *)0x0) goto LAB_00b60bc3;
    uVar13 = 0;
    if (uVar6 != 0) {
      do {
        cVar1 = defaultLangtag[uVar13 - 8];
        if (cVar1 < '\x01') {
          bVar4 = uVar13 < 3;
          uVar13 = uVar13 - 3;
          if (bVar4) {
            uVar13 = 0;
          }
        }
        else {
          content[uVar13] = (short)cVar1;
        }
      } while (('\0' < cVar1) && (uVar13 = uVar13 + 1, uVar13 < uVar15));
    }
    if (uVar15 - uVar13 == 0) {
      content[uVar15] = L'\0';
      uVar14 = (ulong)uVar6;
LAB_00b60c11:
      uVar16 = uVar14;
      if (content[uVar14] != L'\0') {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                                    ,0xaa,"(destString[*destCount] == 0)",
                                    "destString[*destCount] == 0");
        if (!bVar4) goto LAB_00b60cf2;
        *puVar9 = 0;
      }
    }
    else {
      cVar8 = utf8::ByteIndexIntoCharacterIndex
                        ((LPCUTF8)(defaultLangtag + (uVar13 - 8)),uVar15 - uVar13,doDefault);
      uVar14 = (ulong)((int)uVar13 + cVar8);
      uVar16 = 0;
      if (uVar14 <= uVar15) {
        utf8::DecodeUnitsIntoAndNullTerminateNoAdvance
                  (content + uVar13,(LPCUTF8)(defaultLangtag + (uVar13 - 8)),
                   (LPCUTF8)(defaultLangtag + (uVar15 - 8)),doAllowInvalidWCHARs,(bool *)0x0);
        goto LAB_00b60c11;
      }
    }
  }
  if (uVar16 != uVar15) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x590,
                                "(defaultLangtag16Actual == static_cast<size_t>(langtagActual))",
                                "Language tags should always be ASCII");
    if (!bVar4) {
LAB_00b60cf2:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  pJVar11 = JavascriptString::NewWithBuffer(content,(charcount_t)uVar16,pSVar2);
  return pJVar11;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_GetDefaultLocale(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

#ifdef INTL_WINGLOB
        char16 defaultLocale[LOCALE_NAME_MAX_LENGTH];
        defaultLocale[0] = '\0';

        if (GetUserDefaultLocaleName(defaultLocale, _countof(defaultLocale)) == 0)
        {
            JavascriptError::MapAndThrowError(scriptContext, HRESULT_FROM_WIN32(GetLastError()));
        }

        return JavascriptString::NewCopySz(defaultLocale, scriptContext);
#else
        UErrorCode status = U_ZERO_ERROR;
        char defaultLangtag[ULOC_FULLNAME_CAPACITY] = { 0 };
        char defaultLocaleID[ULOC_FULLNAME_CAPACITY] = { 0 };

        int localeIDActual = uloc_getName(nullptr, defaultLocaleID, _countof(defaultLocaleID), &status);
        ICU_ASSERT(status, localeIDActual > 0 && localeIDActual < _countof(defaultLocaleID));

        int langtagActual = uloc_toLanguageTag(defaultLocaleID, defaultLangtag, _countof(defaultLangtag), true, &status);
        ICU_ASSERT(status, langtagActual > 0 && langtagActual < _countof(defaultLangtag));

        char16 *defaultLangtag16 = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, langtagActual + 1);
        charcount_t defaultLangtag16Actual = 0;
        utf8::NarrowStringToWideNoAlloc(defaultLangtag, static_cast<size_t>(langtagActual), defaultLangtag16, langtagActual + 1, &defaultLangtag16Actual);
        AssertOrFailFastMsg(defaultLangtag16Actual == static_cast<size_t>(langtagActual), "Language tags should always be ASCII");
        return JavascriptString::NewWithBuffer(defaultLangtag16, defaultLangtag16Actual, scriptContext);
#endif
    }